

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall spirv_cross::Compiler::type_is_top_level_block(Compiler *this,SPIRType *type)

{
  bool bVar1;
  bool bVar2;
  
  if (type->basetype == Struct) {
    bVar1 = ParsedIR::has_decoration(&this->ir,(ID)(type->super_IVariant).self.id,DecorationBlock);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = ParsedIR::has_decoration
                        (&this->ir,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
      return bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Compiler::type_is_top_level_block(const SPIRType &type) const
{
	if (type.basetype != SPIRType::Struct)
		return false;
	return has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);
}